

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_homedir.c
# Opt level: O2

char * homedir(void)

{
  __uid_t __uid;
  char *pcVar1;
  passwd *ppVar2;
  char in_SIL;
  
  pcVar1 = GetEnv("CURL_HOME",in_SIL);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = GetEnv("HOME",in_SIL);
    if (pcVar1 == (char *)0x0) {
      __uid = geteuid();
      ppVar2 = getpwuid(__uid);
      if (((ppVar2 != (passwd *)0x0) && (pcVar1 = ppVar2->pw_dir, pcVar1 != (char *)0x0)) &&
         (*pcVar1 != '\0')) {
        pcVar1 = strdup(pcVar1);
        return pcVar1;
      }
      pcVar1 = (char *)0x0;
    }
  }
  return pcVar1;
}

Assistant:

char *homedir(void)
{
  char *home;

  home = GetEnv("CURL_HOME", FALSE);
  if(home)
    return home;

  home = GetEnv("HOME", FALSE);
  if(home)
    return home;

#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
 {
   struct passwd *pw = getpwuid(geteuid());

   if(pw) {
     home = pw->pw_dir;
     if(home && home[0])
       home = strdup(home);
     else
       home = NULL;
   }
 }
#endif /* PWD-stuff */
#ifdef WIN32
  home = GetEnv("APPDATA", TRUE);
  if(!home)
    home = GetEnv("%USERPROFILE%\\Application Data", TRUE); /* Normally only
                                                               on Win-2K/XP */
#endif /* WIN32 */
  return home;
}